

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::Importer::library(Importer *this,size_t *index)

{
  ulong uVar1;
  ImporterImpl *pIVar2;
  size_type sVar3;
  pointer ppVar4;
  _Base_ptr in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ModelPtr MVar6;
  ulong local_30;
  size_t i;
  iterator it;
  size_t *index_local;
  Importer *this_local;
  
  uVar1 = *(ulong *)in_RDX;
  it._M_node = in_RDX;
  pIVar2 = pFunc((Importer *)index);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::size(&pIVar2->mLibrary);
  if (uVar1 < sVar3) {
    pIVar2 = pFunc((Importer *)index);
    i = (size_t)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
                ::begin(&pIVar2->mLibrary);
    for (local_30 = 0; local_30 < *(ulong *)it._M_node; local_30 = local_30 + 1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>
                    *)&i);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>
                           *)&i);
    std::shared_ptr<libcellml::Model>::shared_ptr
              ((shared_ptr<libcellml::Model> *)this,&ppVar4->second);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<libcellml::Model>::shared_ptr
              ((shared_ptr<libcellml::Model> *)this,(nullptr_t)0x0);
    _Var5._M_pi = extraout_RDX;
  }
  MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar6.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::library(const size_t &index)
{
    if (index >= pFunc()->mLibrary.size()) {
        return nullptr;
    }
    auto it = pFunc()->mLibrary.begin();
    size_t i = 0;
    while (i < index) {
        ++it;
        ++i;
    }
    return it->second;
}